

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

shared_ptr<peg::Ope> __thiscall peg::bkr(peg *this,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar1;
  undefined1 local_28 [24];
  string *name_local;
  
  local_28._16_8_ = name;
  name_local = (string *)this;
  std::make_shared<peg::BackReference,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<peg::Ope>::shared_ptr<peg::BackReference,void>
            ((shared_ptr<peg::Ope> *)this,(shared_ptr<peg::BackReference> *)local_28);
  std::shared_ptr<peg::BackReference>::~shared_ptr((shared_ptr<peg::BackReference> *)local_28);
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<peg::Ope>)sVar1.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Ope> bkr(const std::string& name) {
    return std::make_shared<BackReference>(name);
}